

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

void process_first_pass_stats(AV1_COMP *cpi,FIRSTPASS_STATS *this_frame)

{
  AV1_PRIMARY *pAVar1;
  AV1_PRIMARY *pAVar2;
  FIRSTPASS_STATS *__src;
  int iVar3;
  void *in_RSI;
  AV1_COMP *in_RDI;
  double dVar4;
  int unaff_retaddr;
  double in_stack_00000008;
  int tmp_q;
  double section_inactive_zone;
  double section_intra_skip;
  double section_error;
  double section_length;
  int section_target_bandwidth;
  FIRSTPASS_STATS *total_stats;
  TWO_PASS *twopass;
  PRIMARY_RATE_CONTROL *p_rc;
  RATE_CONTROL *rc;
  CurrentFrame *current_frame;
  AV1_COMMON *cm;
  aom_bit_depth_t in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  FIRSTPASS_STATS *in_stack_ffffffffffffff98;
  AV1_COMP *in_stack_ffffffffffffffa0;
  
  pAVar1 = in_RDI->ppi;
  pAVar2 = in_RDI->ppi;
  __src = ((pAVar2->twopass).stats_buf_ctx)->total_stats;
  if (((((in_RDI->oxcf).rc_cfg.mode != AOM_Q) && ((in_RDI->common).current_frame.frame_number == 0))
      && (in_RDI->gf_frame_index == '\0')) &&
     ((__src != (FIRSTPASS_STATS *)0x0 &&
      (((pAVar2->twopass).stats_buf_ctx)->total_left_stats != (FIRSTPASS_STATS *)0x0)))) {
    if (in_RDI->ppi->lap_enabled != 0) {
      memcpy(((pAVar2->twopass).stats_buf_ctx)->total_left_stats,__src,0xe8);
    }
    get_section_target_bandwidth(in_RDI);
    dVar4 = ((pAVar2->twopass).stats_buf_ctx)->total_left_stats->count;
    in_stack_ffffffffffffffa0 =
         (AV1_COMP *)(((pAVar2->twopass).stats_buf_ctx)->total_left_stats->intra_skip_pct / dVar4);
    in_stack_ffffffffffffff98 =
         (FIRSTPASS_STATS *)
         ((((pAVar2->twopass).stats_buf_ctx)->total_left_stats->inactive_zone_rows * 2.0) /
         ((double)(in_RDI->common).mi_params.mb_rows * dVar4));
    iVar3 = get_twopass_worst_quality
                      ((AV1_COMP *)section_intra_skip,section_inactive_zone,in_stack_00000008,
                       unaff_retaddr);
    (in_RDI->rc).active_worst_quality = iVar3;
    (in_RDI->rc).ni_av_qi = iVar3;
    (pAVar1->p_rc).last_q[1] = iVar3;
    dVar4 = av1_convert_qindex_to_q(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
    (pAVar1->p_rc).avg_q = dVar4;
    (pAVar1->p_rc).avg_frame_qindex[1] = iVar3;
    (pAVar1->p_rc).last_q[0] = (iVar3 + (in_RDI->oxcf).rc_cfg.best_allowed_q) / 2;
    (pAVar1->p_rc).avg_frame_qindex[0] = (pAVar1->p_rc).last_q[0];
  }
  if ((in_RDI->twopass_frame).stats_in < ((pAVar2->twopass).stats_buf_ctx)->stats_in_end) {
    memcpy(in_RSI,(in_RDI->twopass_frame).stats_in,0xe8);
    (in_RDI->twopass_frame).stats_in = (in_RDI->twopass_frame).stats_in + 1;
  }
  set_twopass_params_based_on_fp_stats(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  return;
}

Assistant:

static void process_first_pass_stats(AV1_COMP *cpi,
                                     FIRSTPASS_STATS *this_frame) {
  AV1_COMMON *const cm = &cpi->common;
  CurrentFrame *const current_frame = &cm->current_frame;
  RATE_CONTROL *const rc = &cpi->rc;
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  TWO_PASS *const twopass = &cpi->ppi->twopass;
  FIRSTPASS_STATS *total_stats = twopass->stats_buf_ctx->total_stats;

  if (cpi->oxcf.rc_cfg.mode != AOM_Q && current_frame->frame_number == 0 &&
      cpi->gf_frame_index == 0 && total_stats &&
      twopass->stats_buf_ctx->total_left_stats) {
    if (cpi->ppi->lap_enabled) {
      /*
       * Accumulate total_stats using available limited number of stats,
       * and assign it to total_left_stats.
       */
      *twopass->stats_buf_ctx->total_left_stats = *total_stats;
    }
    // Special case code for first frame.
    const int section_target_bandwidth = get_section_target_bandwidth(cpi);
    const double section_length =
        twopass->stats_buf_ctx->total_left_stats->count;
    const double section_error =
        twopass->stats_buf_ctx->total_left_stats->coded_error / section_length;
    const double section_intra_skip =
        twopass->stats_buf_ctx->total_left_stats->intra_skip_pct /
        section_length;
    const double section_inactive_zone =
        (twopass->stats_buf_ctx->total_left_stats->inactive_zone_rows * 2) /
        ((double)cm->mi_params.mb_rows * section_length);
    const int tmp_q = get_twopass_worst_quality(
        cpi, section_error, section_intra_skip + section_inactive_zone,
        section_target_bandwidth);

    rc->active_worst_quality = tmp_q;
    rc->ni_av_qi = tmp_q;
    p_rc->last_q[INTER_FRAME] = tmp_q;
    p_rc->avg_q = av1_convert_qindex_to_q(tmp_q, cm->seq_params->bit_depth);
    p_rc->avg_frame_qindex[INTER_FRAME] = tmp_q;
    p_rc->last_q[KEY_FRAME] = (tmp_q + cpi->oxcf.rc_cfg.best_allowed_q) / 2;
    p_rc->avg_frame_qindex[KEY_FRAME] = p_rc->last_q[KEY_FRAME];
  }

  if (cpi->twopass_frame.stats_in < twopass->stats_buf_ctx->stats_in_end) {
    *this_frame = *cpi->twopass_frame.stats_in;
    ++cpi->twopass_frame.stats_in;
  }
  set_twopass_params_based_on_fp_stats(cpi, this_frame);
}